

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::FeedbackPrimitiveTypeCase::
getTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  size_t sVar1;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  long lVar5;
  bool *pbVar6;
  char *__s;
  bool bVar7;
  ostringstream buf;
  ContextType local_1b4;
  string local_1b0;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(",0x36);
  pcVar4 = "isolines";
  if (*(int *)((long)this + 0x78) == 1) {
    pcVar4 = "quads";
  }
  __s = "triangles";
  if (*(int *)((long)this + 0x78) != 0) {
    __s = pcVar4;
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
  bVar7 = *(int *)((long)this + 0x7c) == 0;
  pbVar6 = (bool *)0x1c69a02;
  if (bVar7) {
    pbVar6 = ::glcts::fixed_sample_locations_values + 1;
  }
  lVar5 = 0xc;
  if (bVar7) {
    lVar5 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pbVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             ") in;\n\nout highp vec4 v_tessellationCoords;\n\n// note: No need to use precise gl_Position since we do not require gapless geometry\nvoid main (void)\n{\n\tif (gl_PatchVerticesIn != 9)\n\t\treturn;\n\n\tvec4 patchCentroid = vec4(0.0);\n\tfor (int ndx = 0; ndx < gl_PatchVerticesIn; ++ndx)\n\t\tpatchCentroid += gl_in[ndx].gl_Position;\n\tpatchCentroid /= patchCentroid.w;\n\n"
             ,0x162);
  uVar2 = (ulong)*(uint *)((long)this + 0x78);
  if (uVar2 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01c7d398 + *(int *)(&DAT_01c7d398 + uVar2 * 4),
               *(long *)(&DAT_01c7d3a8 + uVar2 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tv_tessellationCoords = vec4(gl_TessCoord, 0.0);\n}\n",0x33);
  std::__cxx11::stringbuf::str();
  local_1b4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_1b0,&local_1b4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  psVar3 = (string *)std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return psVar3;
}

Assistant:

std::string FeedbackPrimitiveTypeCase::getTessellationEvaluationSource (void) const
{
	std::ostringstream buf;

	buf <<	"${VERSION_DECL}\n"
			"${EXTENSION_TESSELATION_SHADER}"
			"layout("
				<< ((m_tessellationOutput == TESSELLATION_OUT_TRIANGLES) ? ("triangles") : (m_tessellationOutput == TESSELLATION_OUT_QUADS) ? ("quads") : ("isolines"))
				<< ((m_tessellationPointMode) ? (", point_mode") : (""))
				<< ") in;\n"
			"\n"
			"out highp vec4 v_tessellationCoords;\n"
			"\n"
			"// note: No need to use precise gl_Position since we do not require gapless geometry\n"
			"void main (void)\n"
			"{\n"
			"	if (gl_PatchVerticesIn != 9)\n"
			"		return;\n"
			"\n"
			"	vec4 patchCentroid = vec4(0.0);\n"
			"	for (int ndx = 0; ndx < gl_PatchVerticesIn; ++ndx)\n"
			"		patchCentroid += gl_in[ndx].gl_Position;\n"
			"	patchCentroid /= patchCentroid.w;\n"
			"\n";

	if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
		buf <<	"	// map barycentric coords to 2d coords\n"
				"	const vec3 tessDirX = vec3( 0.4,  0.4, 0.0);\n"
				"	const vec3 tessDirY = vec3( 0.0, -0.4, 0.0);\n"
				"	const vec3 tessDirZ = vec3(-0.4,  0.4, 0.0);\n"
				"	gl_Position = patchCentroid + vec4(gl_TessCoord.x * tessDirX + gl_TessCoord.y * tessDirY + gl_TessCoord.z * tessDirZ, 0.0);\n";
	else if (m_tessellationOutput == TESSELLATION_OUT_QUADS || m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
		buf <<	"	gl_Position = patchCentroid + vec4(gl_TessCoord.x * 0.8 - 0.4, gl_TessCoord.y * 0.8 - 0.4, 0.0, 0.0);\n";
	else
		DE_ASSERT(false);

	buf <<	"	v_tessellationCoords = vec4(gl_TessCoord, 0.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}